

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_dlm(CImg<unsigned_char> *this,FILE *file,char *filename)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  CImgArgumentException *this_00;
  CImgIOException *this_01;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  uint size_y;
  uint uVar6;
  char c;
  FILE *local_88;
  char *local_80;
  double val;
  CImg<char> delimiter;
  CImg<char> tmp;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar4 = "non-";
    if (this->_is_shared != false) {
      pcVar4 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_dlm(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar4,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  __stream = (FILE *)file;
  if (file == (FILE *)0x0) {
    __stream = cimg::fopen(filename,"r");
  }
  CImg<char>::CImg(&delimiter,0x100,1,1,1);
  CImg<char>::CImg(&tmp,0x100,1,1,1);
  *tmp._data = '\0';
  *delimiter._data = '\0';
  local_80 = filename;
  assign(this,0x100,0x100,1,1);
  uVar6 = 0;
  uVar2 = 0;
  size_y = 0;
  local_88 = file;
  while( true ) {
    iVar1 = __isoc99_fscanf(__stream,"%lf%255[^0-9eEinfa.+-]",&val,delimiter._data);
    if (iVar1 < 1) break;
    uVar3 = this->_width * size_y + uVar6;
    uVar6 = uVar6 + 1;
    this->_data[uVar3] = (uchar)(int)val;
    if (this->_width <= uVar6) {
      resize(this,this->_width * 3 >> 1,this->_height,1,1,0,0,0.0,0.0,0.0,0.0);
    }
    c = '\0';
    iVar1 = __isoc99_sscanf(delimiter._data,"%255[^\n]%c",tmp._data,&c);
    if ((iVar1 == 0) || (c == '\n')) {
      if (uVar2 < uVar6) {
        uVar2 = uVar6;
      }
      size_y = size_y + 1;
      uVar6 = 0;
      if (this->_height <= size_y) {
        uVar6 = 0;
        resize(this,this->_width,this->_height * 3 >> 1,1,1,0,0,0.0,0.0,0.0,0.0);
      }
    }
  }
  if ((uVar2 != 0) && (size_y != 0)) {
    resize(this,uVar2,size_y,1,1,0,0,0.0,0.0,0.0,0.0);
    if (local_88 == (FILE *)0x0) {
      if (__stream == (FILE *)0x0) {
        cimg::warn("cimg::fclose(): Specified file is (null).");
      }
      else if ((_stdin != __stream) && (_stdout != __stream)) {
        uVar2 = fclose(__stream);
        if (uVar2 != 0) {
          cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar2);
        }
      }
    }
    if ((tmp._is_shared == false) && (tmp._data != (char *)0x0)) {
      operator_delete__(tmp._data);
    }
    if ((delimiter._is_shared == false) && (delimiter._data != (char *)0x0)) {
      operator_delete__(delimiter._data);
    }
    return this;
  }
  if (local_88 == (FILE *)0x0) {
    cimg::fclose(__stream);
  }
  this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
  pcVar4 = "non-";
  if (this->_is_shared != false) {
    pcVar4 = "";
  }
  pcVar5 = "(FILE*)";
  if (local_80 != (char *)0x0) {
    pcVar5 = local_80;
  }
  CImgIOException::CImgIOException
            (this_01,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_dlm(): Invalid DLM file \'%s\'.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar4,"unsigned char",pcVar5);
  __cxa_throw(this_01,&CImgIOException::typeinfo,CImgException::~CImgException);
}

Assistant:

CImg<T>& _load_dlm(std::FILE *const file, const char *const filename) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_dlm(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"r");
      CImg<charT> delimiter(256), tmp(256); *delimiter = *tmp = 0;
      unsigned int cdx = 0, dx = 0, dy = 0;
      int err = 0;
      double val;
      assign(256,256);
      while ((err = std::fscanf(nfile,"%lf%255[^0-9eEinfa.+-]",&val,delimiter._data))>0) {
        if (err>0) (*this)(cdx++,dy) = (T)val;
        if (cdx>=_width) resize(3*_width/2,_height,1,1,0);
        char c = 0;
        if (!cimg_sscanf(delimiter,"%255[^\n]%c",tmp._data,&c) || c=='\n') {
          dx = cimg::max(cdx,dx);
          if (++dy>=_height) resize(_width,3*_height/2,1,1,0);
          cdx = 0;
        }
      }
      if (cdx && err==1) { dx = cdx; ++dy; }
      if (!dx || !dy) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_dlm(): Invalid DLM file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      resize(dx,dy,1,1,0);
      if (!file) cimg::fclose(nfile);
      return *this;
    }